

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O2

FinalStats * __thiscall
density_tests::
QueueGenericTester<density::sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>
::FinalStats::operator+=(FinalStats *this,FinalStats *i_source)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  pointer pPVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  
  pPVar4 = (i_source->m_counters).
           super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(i_source->m_counters).
                super__Vector_base<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters,_std::allocator<density_tests::QueueGenericTester<density::conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>_>::PutTypeCounters>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar4 >> 4;
  lVar5 = *(long *)this;
  lVar9 = 0;
  while (bVar10 = lVar8 != 0, lVar8 = lVar8 + -1, bVar10) {
    plVar1 = (long *)((long)&pPVar4->m_existing + lVar9);
    lVar6 = plVar1[1];
    plVar2 = (long *)(lVar5 + lVar9);
    lVar7 = plVar2[1];
    plVar3 = (long *)(lVar5 + lVar9);
    *plVar3 = *plVar2 + *plVar1;
    plVar3[1] = lVar7 + lVar6;
    lVar9 = lVar9 + 0x10;
  }
  lVar5 = i_source->m_exceptions_during_consumes;
  *(long *)(this + 0x18) = *(long *)(this + 0x18) + i_source->m_exceptions_during_puts;
  *(long *)(this + 0x20) = *(long *)(this + 0x20) + lVar5;
  return (FinalStats *)this;
}

Assistant:

FinalStats & operator+=(const FinalStats & i_source)
            {
                auto const count = i_source.m_counters.size();
                for (size_t i = 0; i < count; i++)
                {
                    m_counters[i].m_existing += i_source.m_counters[i].m_existing;
                    m_counters[i].m_spawned += i_source.m_counters[i].m_spawned;
                }
                m_exceptions_during_puts += i_source.m_exceptions_during_puts;
                m_exceptions_during_consumes += i_source.m_exceptions_during_consumes;
                return *this;
            }